

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O0

void __thiscall imrt::Plan::writeIntensities(Plan *this,string *file,int n)

{
  bool bVar1;
  iterator this_00;
  iterator myfile_00;
  int in_EDX;
  _Ios_Openmode in_ESI;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *in_RDI;
  Station *station;
  iterator __end1;
  iterator __begin1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1;
  double F;
  int angle5;
  int angle4;
  int angle3;
  int angle2;
  int angle1;
  int i;
  string line;
  ifstream myfile;
  double local_270;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  string local_250 [48];
  string local_220 [524];
  int local_14;
  
  local_14 = in_EDX;
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,in_ESI);
  std::__cxx11::string::string(local_250);
  for (local_254 = 0; local_254 < local_14; local_254 = local_254 + 1) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_220,local_250);
  }
  std::istream::operator>>(local_220,&local_258);
  std::istream::operator>>(local_220,&local_25c);
  std::istream::operator>>(local_220,&local_260);
  std::istream::operator>>(local_220,&local_264);
  std::istream::operator>>(local_220,&local_268);
  std::istream::operator>>(local_220,&local_270);
  this_00 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin(in_RDI);
  myfile_00 = std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end(in_RDI);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xfffffffffffffd80,(_Self *)&stack0xfffffffffffffd78);
    if (!bVar1) break;
    std::_List_iterator<imrt::Station_*>::operator*((_List_iterator<imrt::Station_*> *)0x15ac61);
    Station::writeIntensity((Station *)this_00._M_node,(ifstream *)myfile_00._M_node);
    std::_List_iterator<imrt::Station_*>::operator++
              ((_List_iterator<imrt::Station_*> *)&stack0xfffffffffffffd80);
  }
  std::__cxx11::string::~string(local_250);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void Plan::writeIntensities(string file, int n) {
  	ifstream myfile;
  	myfile.open(file);

    std::string line;
    for(int i=0; i<n; i++) std::getline(myfile, line);

  	int angle1, angle2, angle3, angle4, angle5;
  	double F;
  	myfile >> angle1;
  	myfile >> angle2;
  	myfile >> angle3;
  	myfile >> angle4;
  	myfile >> angle5;
  	myfile >> F;

  	for(auto station:stations){
  		station->writeIntensity(myfile);
  	}

  }